

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.h
# Opt level: O0

void __thiscall Triangle::Triangle(Triangle *this,Vector3f *a,Vector3f *b,Vector3f *c,Material *m)

{
  Object *pOVar1;
  Vector3f *pVVar2;
  float *pfVar3;
  bool bVar4;
  uint uVar5;
  Triangle *in_RSI;
  Object *in_RDI;
  Material *in_R8;
  float fVar6;
  Vector3f *in_stack_ffffffffffffff28;
  Vector3f *local_c0;
  int *this_00;
  Vector3f *v1;
  int *v0;
  float *local_88;
  
  Object::Object(in_RDI,in_R8);
  in_RDI->_vptr_Object = (_func_int **)&PTR_intersect_003d2aa8;
  *(undefined1 *)&in_RDI[1]._vptr_Object = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_Object + 2) = 0;
  pOVar1 = in_RDI + 2;
  pfVar3 = (float *)((long)&in_RDI[1]._vptr_Object + 4);
  do {
    local_88 = pfVar3;
    Vector2f::Vector2f((Vector2f *)local_88,0.0);
    pfVar3 = local_88 + 2;
  } while (local_88 + 2 != (float *)((long)&pOVar1->_vptr_Object + 4));
  v1 = (Vector3f *)((long)&in_RDI[3].m + 4);
  v0 = &in_RDI[2].remit;
  do {
    this_00 = v0;
    Vector3f::Vector3f((Vector3f *)this_00,0.0);
    v0 = this_00 + 3;
  } while ((Vector3f *)v0 != v1);
  pOVar1 = in_RDI + 5;
  pVVar2 = (Vector3f *)((long)&in_RDI[3].m + 4);
  do {
    local_c0 = pVVar2;
    Vector3f::Vector3f(local_c0,0.0);
    pVVar2 = local_c0 + 1;
  } while (local_c0 + 1 != (Vector3f *)&pOVar1->remit);
  Vector3f::Vector3f((Vector3f *)&in_RDI[5].remit,0.0);
  Matrix3f::Matrix3f((Matrix3f *)((long)&in_RDI[5].m + 4),0.0);
  Vector3f::operator=(local_c0,in_stack_ffffffffffffff28);
  Vector3f::operator=(local_c0,in_stack_ffffffffffffff28);
  Vector3f::operator=(local_c0,in_stack_ffffffffffffff28);
  ::operator-((Vector3f *)v0,v1);
  ::operator-((Vector3f *)v0,v1);
  Vector3f::cross((Vector3f *)in_RDI,(Vector3f *)local_88);
  fVar6 = Vector3f::length((Vector3f *)0x358766);
  *(float *)((long)&in_RDI[2]._vptr_Object + 4) = fVar6 / 2.0;
  if (1e-05 <= *(float *)((long)&in_RDI[2]._vptr_Object + 4)) {
    uVar5 = (*in_R8->_vptr_Material[4])();
    if (((uVar5 & 1) != 0) && (bVar4 = Texture::is_empty((Texture *)(in_R8 + 0x1c)), !bVar4)) {
      in_RDI->remit = 1;
    }
    ::operator-((Vector3f *)v0,v1);
    ::operator-((Vector3f *)v0,v1);
    Vector3f::cross((Vector3f *)in_RDI,(Vector3f *)local_88);
    Vector3f::normalized((Vector3f *)this_00);
    Vector3f::operator=(local_c0,in_stack_ffffffffffffff28);
    *(undefined1 *)((long)&in_RDI[1]._vptr_Object + 1) = 0;
    uVar5 = (*in_R8->_vptr_Material[2])();
    if ((uVar5 & 1) != 0) {
      prepare_coords(in_RSI);
    }
  }
  else {
    *(undefined1 *)&in_RDI[1]._vptr_Object = 1;
  }
  return;
}

Assistant:

Triangle(const Vector3f& a, const Vector3f& b, const Vector3f& c, Material* m):Object(m) {
		v[0] = a;
		v[1] = b;
		v[2] = c;
		area = Vector3f::cross(a - b, a - c).length() / 2;
		if (area < 1e-5)
		{
			empty = true;
			return;
		}
#ifdef TRIANGLE_REMIT
		if (m->is_brdf() && !((BRDFMaterial*)m)->emissionColor.is_empty())
			remit = 1;
#endif
		n[0] = Vector3f::cross(a - b,a - c).normalized(); use_n = false;
		if (m->need_coords()) prepare_coords();
	}